

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  ImGuiWindowSettings *pIVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char *__haystack;
  ulong uVar8;
  long lVar9;
  
  uVar3 = (imgui_ctx->Windows).Size;
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      pIVar2 = (imgui_ctx->Windows).Data[uVar8];
      if ((pIVar2->Flags & 0x100) == 0) {
        if ((long)pIVar2->SettingsIdx == -1) {
          uVar7 = (ulong)(uint)(GImGui->SettingsWindows).Size;
          if (uVar7 != 0) {
            pIVar4 = (GImGui->SettingsWindows).Data;
            do {
              if (pIVar4->ID == pIVar2->ID) goto LAB_0011fad6;
              pIVar4 = pIVar4 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
LAB_0011fab7:
          pIVar4 = ImGui::CreateNewWindowSettings(pIVar2->Name);
          pIVar2->SettingsIdx =
               (int)((ulong)((long)pIVar4 - (long)(imgui_ctx->SettingsWindows).Data) >> 5);
        }
        else {
          pIVar4 = (imgui_ctx->SettingsWindows).Data;
          if (pIVar4 == (ImGuiWindowSettings *)0x0) goto LAB_0011fab7;
          pIVar4 = pIVar4 + pIVar2->SettingsIdx;
        }
LAB_0011fad6:
        pIVar4->Pos = pIVar2->Pos;
        pIVar4->Size = pIVar2->SizeFull;
        pIVar4->Collapsed = pIVar2->Collapsed;
        uVar3 = (imgui_ctx->Windows).Size;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar3);
  }
  iVar6 = 0;
  if ((buf->Buf).Data != (char *)0x0) {
    iVar6 = (buf->Buf).Size + -1;
  }
  ImGuiTextBuffer::reserve(buf,(imgui_ctx->SettingsWindows).Size * 0x60 + iVar6);
  uVar3 = (imgui_ctx->SettingsWindows).Size;
  if (uVar3 != 0) {
    lVar9 = 0x1c;
    uVar8 = 0;
    do {
      pIVar4 = (imgui_ctx->SettingsWindows).Data;
      fVar1 = *(float *)((long)pIVar4 + lVar9 + -0x10);
      if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
        __haystack = *(char **)((long)pIVar4 + lVar9 + -0x1c);
        pcVar5 = strstr(__haystack,"###");
        if (pcVar5 != (char *)0x0) {
          __haystack = pcVar5;
        }
        ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,__haystack);
        ImGuiTextBuffer::appendf
                  (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar4 + lVar9 + -0x10),
                   (ulong)(uint)(int)*(float *)((long)pIVar4 + lVar9 + -0xc));
        ImGuiTextBuffer::appendf
                  (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar4 + lVar9 + -8),
                   (ulong)(uint)(int)*(float *)((long)pIVar4 + lVar9 + -4));
        ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar4->Name + lVar9))
        ;
        ImGuiTextBuffer::appendf(buf,"\n");
        uVar3 = (imgui_ctx->SettingsWindows).Size;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar8 != uVar3);
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}